

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderBitfieldOperationTests.cpp
# Opt level: O0

bool __thiscall
glcts::ShaderBitfieldOperationCaseBinaryUint::test
          (ShaderBitfieldOperationCaseBinaryUint *this,Data *data)

{
  GLuint GVar1;
  GLuint local_28;
  GLuint expected;
  GLuint expected2;
  int i;
  Data *data_local;
  ShaderBitfieldOperationCaseBinaryUint *this_local;
  
  expected = 0;
  _expected2 = data;
  data_local = (Data *)this;
  while( true ) {
    if (this->m_components <= (int)expected) {
      return true;
    }
    local_28 = 0;
    GVar1 = (*this->m_func)(_expected2->inUvec4[(int)expected],_expected2->in2Uvec4[(int)expected],
                            &local_28);
    if ((_expected2->outUvec4[(int)expected] != GVar1) ||
       (_expected2->out2Uvec4[(int)expected] != local_28)) break;
    expected = expected + 1;
  }
  return false;
}

Assistant:

virtual bool test(Data const* data)
	{
		for (int i = 0; i < m_components; ++i)
		{
			GLuint expected2 = 0;
			GLuint expected  = m_func(data->inUvec4[i], data->in2Uvec4[i], expected2);
			if (data->outUvec4[i] != expected || data->out2Uvec4[i] != expected2)
			{
				return false;
			}
		}
		return true;
	}